

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dec.c
# Opt level: O0

WebPInputFileFormat WebPGuessImageType(uint8_t *data,size_t data_size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong in_RSI;
  uint8_t *in_RDI;
  int type;
  uint32_t magic2;
  uint32_t magic1;
  WebPInputFileFormat format;
  WebPInputFileFormat local_14;
  
  local_14 = WEBP_UNSUPPORTED_FORMAT;
  if ((in_RDI != (uint8_t *)0x0) && (0xb < in_RSI)) {
    uVar1 = GetBE32(in_RDI);
    uVar2 = GetBE32(in_RDI + 8);
    if (uVar1 == 0x89504e47) {
      local_14 = WEBP_PNG_FORMAT;
    }
    else if ((uVar1 < 0xffd8ff00) || (0xffd8ffff < uVar1)) {
      if ((uVar1 == 0x49492a00) || (uVar1 == 0x4d4d002a)) {
        local_14 = WEBP_TIFF_FORMAT;
      }
      else if ((uVar1 == 0x52494646) && (uVar2 == 0x57454250)) {
        local_14 = WEBP_WEBP_FORMAT;
      }
      else if ((uVar1 >> 0x18 == 0x50) &&
              ((uVar3 = uVar1 >> 0x10 & 0xff, 0x34 < uVar3 && (uVar3 < 0x38)))) {
        local_14 = WEBP_PNM_FORMAT;
      }
    }
    else {
      local_14 = WEBP_JPEG_FORMAT;
    }
  }
  return local_14;
}

Assistant:

WebPInputFileFormat WebPGuessImageType(const uint8_t* const data,
                                       size_t data_size) {
  WebPInputFileFormat format = WEBP_UNSUPPORTED_FORMAT;
  if (data != NULL && data_size >= 12) {
    const uint32_t magic1 = GetBE32(data + 0);
    const uint32_t magic2 = GetBE32(data + 8);
    if (magic1 == 0x89504E47U) {
      format = WEBP_PNG_FORMAT;
    } else if (magic1 >= 0xFFD8FF00U && magic1 <= 0xFFD8FFFFU) {
      format = WEBP_JPEG_FORMAT;
    } else if (magic1 == 0x49492A00 || magic1 == 0x4D4D002A) {
      format = WEBP_TIFF_FORMAT;
    } else if (magic1 == 0x52494646 && magic2 == 0x57454250) {
      format = WEBP_WEBP_FORMAT;
    } else if (((magic1 >> 24) & 0xff) == 'P') {
      const int type = (magic1 >> 16) & 0xff;
      // we only support 'P5 -> P7' for now.
      if (type >= '5' && type <= '7') format = WEBP_PNM_FORMAT;
    }
  }
  return format;
}